

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O2

void __thiscall irr::gui::CGUITabControl::draw(CGUITabControl *this)

{
  uint uVar1;
  pointer ppIVar2;
  IGUITab *pIVar3;
  IGUIButton *pIVar4;
  uint uVar5;
  undefined4 uVar6;
  s32 sVar7;
  int iVar8;
  uint uVar9;
  undefined4 uVar10;
  long *plVar11;
  IGUIFont *font;
  wchar_t *pwVar12;
  undefined8 extraout_RDX;
  ulong uVar13;
  long *plVar14;
  long lVar15;
  uint uVar16;
  rect<int> *prVar17;
  u32 i;
  ulong uVar18;
  rect<int> frameRect;
  rect<int> *in_stack_ffffffffffffff18;
  uint *puVar19;
  rect<int> *prVar20;
  uint local_d8;
  int iStack_d4;
  uint uStack_d0;
  int iStack_cc;
  uint local_c4;
  rect<int> *local_c0;
  ulong local_b8;
  undefined1 *local_b0;
  long *local_a8;
  IGUITab *local_a0;
  rect<int> tr;
  rect<int> textClipRect;
  string<wchar_t> local_50;
  
  if ((this->field_0xa0 == '\x01') &&
     (plVar11 = (long *)(**(code **)(**(long **)&this->field_0x128 + 0x60))(),
     plVar11 != (long *)0x0)) {
    font = (IGUIFont *)(**(code **)(*plVar11 + 0x30))(plVar11,0);
    local_a8 = (long *)(**(code **)(**(long **)&this->field_0x128 + 0x30))();
    local_d8 = *(uint *)&this->field_0x40;
    iStack_d4 = *(int *)&this->field_0x44;
    uStack_d0 = *(uint *)&this->field_0x48;
    iStack_cc = *(int *)&this->field_0x4c;
    if ((this->Tabs).m_data.
        super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->Tabs).m_data.
        super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      uVar6 = (**(code **)*plVar11)(plVar11,3);
      (**(code **)(*local_a8 + 0x198))(local_a8,uVar6,&local_d8,&this->field_0x50);
    }
    if (font != (IGUIFont *)0x0) {
      if (this->VerticalAlignment == EGUIA_UPPERLEFT) {
        iStack_d4 = iStack_d4 + 2;
        iStack_cc = iStack_d4 + this->TabHeight;
      }
      else {
        iStack_d4 = ~this->TabHeight + iStack_cc;
        iStack_cc = iStack_cc + -2;
      }
      local_b0 = &this->field_0x40;
      tr.UpperLeftCorner.X = 0;
      tr.UpperLeftCorner.Y = 0;
      tr.LowerRightCorner.X = 0;
      tr.LowerRightCorner.Y = 0;
      uVar1 = this->CurrentScrollTabIndex;
      uVar18 = (ulong)uVar1;
      local_c0 = (rect<int> *)&this->field_0x50;
      local_a0 = (IGUITab *)0x0;
      local_b8 = 0;
      uVar5 = 0;
      uVar13 = 0;
      uVar9 = local_d8 + 2;
      while( true ) {
        prVar17 = local_c0;
        uVar6 = (undefined4)((ulong)in_stack_ffffffffffffff18 >> 0x20);
        ppIVar2 = (this->Tabs).m_data.
                  super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if ((((ulong)((long)(this->Tabs).m_data.
                            super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar2) >> 3 &
             0xffffffff) <= uVar18) || ((uVar13 & 1) != 0)) break;
        pIVar3 = ppIVar2[uVar18];
        if (pIVar3 == (IGUITab *)0x0) {
          pwVar12 = (wchar_t *)0x0;
        }
        else {
          pwVar12 = (wchar_t *)
                    (**(code **)(*(long *)&(pIVar3->super_IGUIElement).super_IEventReceiver + 0xa8))
                              ();
        }
        sVar7 = calcTabWidth(this,font,pwVar12);
        prVar17 = local_c0;
        if (this->ScrollControl == true) {
          iVar8 = ((this->UpButton->super_IGUIElement).AbsoluteRect.UpperLeftCorner.X - uVar9) + -2;
          uVar13 = CONCAT71((int7)((ulong)extraout_RDX >> 8),iVar8 < sVar7);
          if (iVar8 < sVar7) {
            sVar7 = iVar8;
          }
        }
        else {
          uVar13 = 0;
        }
        uVar16 = sVar7 + uVar9;
        local_d8 = uVar9;
        uStack_d0 = uVar16;
        if (uVar18 == (uint)this->ActiveTabIndex) {
          local_a0 = (this->Tabs).m_data.
                     super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar18];
          local_b8 = (ulong)uVar16;
          uVar5 = uVar9;
        }
        else {
          local_c4 = (uint)uVar13;
          (**(code **)(*plVar11 + 0x90))(plVar11,this,0,&local_d8,local_c0,this->VerticalAlignment);
          textClipRect.UpperLeftCorner.Y = iStack_d4;
          textClipRect.UpperLeftCorner.X = local_d8;
          textClipRect.LowerRightCorner.Y = iStack_cc;
          textClipRect.LowerRightCorner.X = uStack_d0;
          core::rect<int>::clipAgainst(&textClipRect,prVar17);
          core::string<wchar_t>::string<wchar_t>(&local_50,pwVar12);
          uVar9 = (**(code **)(*(long *)&((this->Tabs).m_data.
                                          super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar18]->
                                         super_IGUIElement).super_IEventReceiver + 0x148))();
          in_stack_ffffffffffffff18 = &textClipRect;
          (**font->_vptr_IGUIFont)
                    (font,&local_50,&local_d8,(ulong)uVar9,1,1,in_stack_ffffffffffffff18);
          ::std::__cxx11::wstring::_M_dispose();
          uVar13 = (ulong)local_c4;
        }
        uVar18 = uVar18 + 1;
        uVar9 = uVar16;
      }
      local_c4 = (uint)uVar13;
      if ((uVar5 == 0) || (((int)local_b8 == 0 || (local_a0 == (IGUITab *)0x0)))) {
        tr.UpperLeftCorner.Y = iStack_cc + -1;
        tr.UpperLeftCorner.X = *(int *)&this->field_0x40;
        tr.LowerRightCorner.Y = iStack_cc;
        tr.LowerRightCorner.X = *(int *)&this->field_0x48;
        if (this->VerticalAlignment == EGUIA_UPPERLEFT) {
          uVar10 = (**(code **)*plVar11)(plVar11,3);
          lVar15 = *local_a8;
          plVar14 = local_a8;
          prVar17 = local_c0;
        }
        else {
          tr.UpperLeftCorner.Y = iStack_d4 + -1;
          tr.LowerRightCorner.Y = iStack_d4;
          uVar10 = (**(code **)*plVar11)(plVar11,0);
          lVar15 = *local_a8;
          plVar14 = local_a8;
          prVar17 = local_c0;
        }
      }
      else {
        local_d8 = uVar5 - 2;
        uStack_d0 = (int)local_b8 + 2;
        if (this->VerticalAlignment == EGUIA_UPPERLEFT) {
          iStack_d4 = iStack_d4 + -2;
          (**(code **)(*plVar11 + 0x90))(plVar11,this,1,&local_d8,local_c0,0);
          textClipRect.UpperLeftCorner.Y = iStack_d4;
          textClipRect.UpperLeftCorner.X = local_d8;
          textClipRect.LowerRightCorner.Y = iStack_cc;
          textClipRect.LowerRightCorner.X = uStack_d0;
          core::rect<int>::clipAgainst(&textClipRect,prVar17);
          pIVar3 = local_a0;
          pwVar12 = (wchar_t *)
                    (**(code **)(*(long *)&(local_a0->super_IGUIElement).super_IEventReceiver + 0xa8
                                ))(local_a0);
          core::string<wchar_t>::string<wchar_t>(&local_50,pwVar12);
          uVar9 = (**(code **)(*(long *)&(pIVar3->super_IGUIElement).super_IEventReceiver + 0x148))
                            (pIVar3);
          prVar20 = &textClipRect;
          (**font->_vptr_IGUIFont)(font,&local_50,&local_d8,(ulong)uVar9,1,1,prVar20);
          uVar6 = (undefined4)((ulong)prVar20 >> 0x20);
          ::std::__cxx11::wstring::_M_dispose();
          tr.UpperLeftCorner.Y = iStack_cc + -1;
          tr.UpperLeftCorner.X = *(int *)&this->field_0x40;
          tr.LowerRightCorner.Y = iStack_cc;
          tr.LowerRightCorner.X = uVar5 - 1;
          uVar10 = (**(code **)*plVar11)(plVar11,3);
          plVar14 = local_a8;
          (**(code **)(*local_a8 + 0x198))(local_a8,uVar10,&tr,prVar17);
          tr.UpperLeftCorner.X = (int)local_b8;
          tr.LowerRightCorner.X = *(int *)&this->field_0x48;
          uVar10 = (**(code **)*plVar11)(plVar11,3);
          lVar15 = *plVar14;
        }
        else {
          iStack_cc = iStack_cc + 2;
          (**(code **)(*plVar11 + 0x90))(plVar11,this,1,&local_d8,local_c0);
          pIVar3 = local_a0;
          pwVar12 = (wchar_t *)
                    (**(code **)(*(long *)&(local_a0->super_IGUIElement).super_IEventReceiver + 0xa8
                                ))(local_a0);
          core::string<wchar_t>::string<wchar_t>(&local_50,pwVar12);
          uVar9 = (**(code **)(*(long *)&(pIVar3->super_IGUIElement).super_IEventReceiver + 0x148))
                            (pIVar3);
          puVar19 = &local_d8;
          (**font->_vptr_IGUIFont)(font,&local_50,puVar19,(ulong)uVar9,1,1,puVar19);
          uVar6 = (undefined4)((ulong)puVar19 >> 0x20);
          ::std::__cxx11::wstring::_M_dispose();
          tr.UpperLeftCorner.Y = iStack_d4 + -1;
          tr.UpperLeftCorner.X = *(int *)&this->field_0x40;
          tr.LowerRightCorner.Y = iStack_d4;
          tr.LowerRightCorner.X = uVar5 - 1;
          uVar10 = (**(code **)*plVar11)(plVar11,0);
          plVar14 = local_a8;
          (**(code **)(*local_a8 + 0x198))(local_a8,uVar10,&tr,prVar17);
          tr.UpperLeftCorner.X = (int)local_b8;
          tr.LowerRightCorner.X = *(int *)&this->field_0x48;
          uVar10 = (**(code **)*plVar11)(plVar11,0);
          lVar15 = *plVar14;
        }
      }
      (**(code **)(lVar15 + 0x198))(plVar14,uVar10,&tr,prVar17);
      (**(code **)(*plVar11 + 0x98))
                (plVar11,this,this->Border,this->FillBackground,local_b0,prVar17,
                 CONCAT44(uVar6,this->TabHeight),this->VerticalAlignment);
      pIVar4 = this->UpButton;
      if (pIVar4 != (IGUIButton *)0x0) {
        (*(pIVar4->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x13])
                  (pIVar4,(ulong)(0 < (int)uVar1));
      }
      pIVar4 = this->DownButton;
      if (pIVar4 != (IGUIButton *)0x0) {
        (*(pIVar4->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x13])
                  (pIVar4,(ulong)(local_c4 & 1));
      }
      refreshSprites(this);
      IGUIElement::draw((IGUIElement *)this);
    }
  }
  return;
}

Assistant:

void CGUITabControl::draw()
{
	if (!IsVisible)
		return;

	IGUISkin *skin = Environment->getSkin();
	if (!skin)
		return;

	IGUIFont *font = skin->getFont();
	video::IVideoDriver *driver = Environment->getVideoDriver();

	core::rect<s32> frameRect(AbsoluteRect);

	// some empty background as placeholder when there are no tabs
	if (Tabs.empty())
		driver->draw2DRectangle(skin->getColor(EGDC_3D_HIGH_LIGHT), frameRect, &AbsoluteClippingRect);

	if (!font)
		return;

	// tab button bar can be above or below the tabs
	if (VerticalAlignment == EGUIA_UPPERLEFT) {
		frameRect.UpperLeftCorner.Y += 2;
		frameRect.LowerRightCorner.Y = frameRect.UpperLeftCorner.Y + TabHeight;
	} else {
		frameRect.UpperLeftCorner.Y = frameRect.LowerRightCorner.Y - TabHeight - 1;
		frameRect.LowerRightCorner.Y -= 2;
	}

	core::rect<s32> tr;
	s32 pos = frameRect.UpperLeftCorner.X + 2;

	bool needLeftScroll = CurrentScrollTabIndex > 0;
	bool needRightScroll = false;

	// left and right pos of the active tab
	s32 left = 0;
	s32 right = 0;

	// const wchar_t* activetext = 0;
	IGUITab *activeTab = 0;

	// Draw all tab-buttons except the active one
	for (u32 i = CurrentScrollTabIndex; i < Tabs.size() && !needRightScroll; ++i) {
		// get Text
		const wchar_t *text = 0;
		if (Tabs[i])
			text = Tabs[i]->getText();

		// get text length
		s32 len = calcTabWidth(font, text);
		if (ScrollControl) {
			s32 space = UpButton->getAbsolutePosition().UpperLeftCorner.X - 2 - pos;
			if (space < len) {
				needRightScroll = true;
				len = space;
			}
		}

		frameRect.LowerRightCorner.X += len;
		frameRect.UpperLeftCorner.X = pos;
		frameRect.LowerRightCorner.X = frameRect.UpperLeftCorner.X + len;

		pos += len;

		if ((s32)i == ActiveTabIndex) {
			// for active button just remember values
			left = frameRect.UpperLeftCorner.X;
			right = frameRect.LowerRightCorner.X;
			// activetext = text;
			activeTab = Tabs[i];
		} else {
			skin->draw3DTabButton(this, false, frameRect, &AbsoluteClippingRect, VerticalAlignment);

			// draw text
			core::rect<s32> textClipRect(frameRect); // TODO: exact size depends on borders in draw3DTabButton which we don't get with current interface
			textClipRect.clipAgainst(AbsoluteClippingRect);
			font->draw(text, frameRect, Tabs[i]->getTextColor(),
					true, true, &textClipRect);
		}
	}

	// Draw active tab button
	// Drawn later than other buttons because it draw over the buttons before/after it.
	if (left != 0 && right != 0 && activeTab != 0) {
		// draw upper highlight frame
		if (VerticalAlignment == EGUIA_UPPERLEFT) {
			frameRect.UpperLeftCorner.X = left - 2;
			frameRect.LowerRightCorner.X = right + 2;
			frameRect.UpperLeftCorner.Y -= 2;

			skin->draw3DTabButton(this, true, frameRect, &AbsoluteClippingRect, VerticalAlignment);

			// draw text
			core::rect<s32> textClipRect(frameRect); // TODO: exact size depends on borders in draw3DTabButton which we don't get with current interface
			textClipRect.clipAgainst(AbsoluteClippingRect);
			font->draw(activeTab->getText(), frameRect, activeTab->getTextColor(),
					true, true, &textClipRect);

			tr.UpperLeftCorner.X = AbsoluteRect.UpperLeftCorner.X;
			tr.LowerRightCorner.X = left - 1;
			tr.UpperLeftCorner.Y = frameRect.LowerRightCorner.Y - 1;
			tr.LowerRightCorner.Y = frameRect.LowerRightCorner.Y;
			driver->draw2DRectangle(skin->getColor(EGDC_3D_HIGH_LIGHT), tr, &AbsoluteClippingRect);

			tr.UpperLeftCorner.X = right;
			tr.LowerRightCorner.X = AbsoluteRect.LowerRightCorner.X;
			driver->draw2DRectangle(skin->getColor(EGDC_3D_HIGH_LIGHT), tr, &AbsoluteClippingRect);
		} else {
			frameRect.UpperLeftCorner.X = left - 2;
			frameRect.LowerRightCorner.X = right + 2;
			frameRect.LowerRightCorner.Y += 2;

			skin->draw3DTabButton(this, true, frameRect, &AbsoluteClippingRect, VerticalAlignment);

			// draw text
			font->draw(activeTab->getText(), frameRect, activeTab->getTextColor(),
					true, true, &frameRect);

			tr.UpperLeftCorner.X = AbsoluteRect.UpperLeftCorner.X;
			tr.LowerRightCorner.X = left - 1;
			tr.UpperLeftCorner.Y = frameRect.UpperLeftCorner.Y - 1;
			tr.LowerRightCorner.Y = frameRect.UpperLeftCorner.Y;
			driver->draw2DRectangle(skin->getColor(EGDC_3D_DARK_SHADOW), tr, &AbsoluteClippingRect);

			tr.UpperLeftCorner.X = right;
			tr.LowerRightCorner.X = AbsoluteRect.LowerRightCorner.X;
			driver->draw2DRectangle(skin->getColor(EGDC_3D_DARK_SHADOW), tr, &AbsoluteClippingRect);
		}
	} else {
		// No active tab
		// Draw a line separating button bar from tab area
		tr.UpperLeftCorner.X = AbsoluteRect.UpperLeftCorner.X;
		tr.LowerRightCorner.X = AbsoluteRect.LowerRightCorner.X;
		tr.UpperLeftCorner.Y = frameRect.LowerRightCorner.Y - 1;
		tr.LowerRightCorner.Y = frameRect.LowerRightCorner.Y;

		if (VerticalAlignment == EGUIA_UPPERLEFT) {
			driver->draw2DRectangle(skin->getColor(EGDC_3D_HIGH_LIGHT), tr, &AbsoluteClippingRect);
		} else {
			tr.UpperLeftCorner.Y = frameRect.UpperLeftCorner.Y - 1;
			tr.LowerRightCorner.Y = frameRect.UpperLeftCorner.Y;
			driver->draw2DRectangle(skin->getColor(EGDC_3D_DARK_SHADOW), tr, &AbsoluteClippingRect);
		}
	}

	// drawing some border and background for the tab-area.
	skin->draw3DTabBody(this, Border, FillBackground, AbsoluteRect, &AbsoluteClippingRect, TabHeight, VerticalAlignment);

	// enable scrollcontrols on need
	if (UpButton)
		UpButton->setEnabled(needLeftScroll);
	if (DownButton)
		DownButton->setEnabled(needRightScroll);
	refreshSprites();

	IGUIElement::draw();
}